

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_add_int(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi_sint b)

{
  int iVar1;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi B;
  mbedtls_mpi_uint local_18;
  mbedtls_mpi local_10;
  
  local_10.p = &local_18;
  local_18 = -b;
  if (0 < b) {
    local_18 = b;
  }
  local_10.s = (ushort)(b >> 0x3e) | 1;
  local_10.n = 1;
  iVar1 = add_sub_mpi(X,A,&local_10,1);
  return iVar1;
}

Assistant:

int mbedtls_mpi_add_int(mbedtls_mpi *X, const mbedtls_mpi *A, mbedtls_mpi_sint b)
{
    mbedtls_mpi B;
    mbedtls_mpi_uint p[1];

    p[0] = mpi_sint_abs(b);
    B.s = TO_SIGN(b);
    B.n = 1;
    B.p = p;

    return mbedtls_mpi_add_mpi(X, A, &B);
}